

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.c
# Opt level: O2

int base64_stream_decode_neon64
              (base64_state *state,char *src,size_t srclen,char *out,size_t *outlen)

{
  return -1;
}

Assistant:

BASE64_DEC_FUNCTION(neon64)
{
#ifdef BASE64_USE_NEON64
	#include "../generic/dec_head.c"
	dec_loop_neon64(&s, &slen, &o, &olen);
	dec_loop_generic_32(&s, &slen, &o, &olen);
	#include "../generic/dec_tail.c"
#else
	BASE64_DEC_STUB
#endif
}